

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_simple_mcc_decorrelation_data_t *poVar2;
  uint uVar3;
  ulong uVar5;
  opj_mct_data_t *poVar6;
  char *pcVar7;
  opj_simple_mcc_decorrelation_data_t *poVar8;
  uint uVar9;
  OPJ_INT32 event_type;
  OPJ_UINT32 OVar10;
  opj_tcp_t *poVar11;
  long lVar12;
  OPJ_BOOL OVar13;
  OPJ_BYTE *pOVar14;
  OPJ_BYTE *p_buffer;
  bool bVar15;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 local_5c;
  OPJ_UINT32 l_nb_comps;
  OPJ_UINT32 l_indix;
  opj_event_mgr_t *local_50;
  undefined4 local_44;
  uint local_40;
  OPJ_UINT32 l_nb_collections;
  opj_mct_data_t **local_38;
  int iVar4;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1522,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1523,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1524,
                  "OPJ_BOOL opj_j2k_read_mcc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar11 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar11 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size < 2) {
LAB_00112575:
    pcVar7 = "Error reading MCC marker\n";
  }
  else {
    opj_read_bytes_LE(p_header_data,&l_tmp,2);
    if (l_tmp != 0) {
      pcVar7 = "Cannot take in charge multiple data spanning\n";
LAB_001125b3:
      opj_event_msg(p_manager,2,pcVar7);
      return 1;
    }
    if (p_header_size < 7) goto LAB_00112575;
    local_5c = p_header_size;
    opj_read_bytes_LE(p_header_data + 2,&l_indix,1);
    poVar2 = poVar11->m_mcc_records;
    uVar9 = poVar11->m_nb_mcc_records;
    uVar5 = (ulong)uVar9;
    poVar8 = poVar2;
    uVar1 = uVar9;
    while( true ) {
      iVar4 = (int)uVar5;
      uVar3 = iVar4 - 1;
      uVar5 = (ulong)uVar3;
      if (iVar4 == 0) break;
      if (poVar8->m_index == l_indix) {
        if (uVar1 != 0) {
          local_44 = 0;
          goto LAB_001126b8;
        }
        break;
      }
      poVar8 = poVar8 + 1;
      uVar1 = uVar3;
    }
    if (uVar9 != poVar11->m_nb_max_mcc_records) {
LAB_001126a9:
      poVar8 = poVar2 + uVar9;
      local_44 = (undefined4)CONCAT71((int7)(uVar5 >> 8),1);
LAB_001126b8:
      poVar8->m_index = l_indix;
      opj_read_bytes_LE(p_header_data + 3,&l_tmp,2);
      if (l_tmp == 0) {
        opj_read_bytes_LE(p_header_data + 5,&l_nb_collections,2);
        if (l_nb_collections < 2) {
          p_buffer = p_header_data + 7;
          local_38 = &poVar8->m_decorrelation_array;
          uVar1 = 0;
          uVar9 = local_5c - 7;
          while (uVar1 < l_nb_collections) {
            if (uVar9 < 3) goto LAB_00112575;
            local_40 = uVar1;
            opj_read_bytes_LE(p_buffer,&l_tmp,1);
            if (l_tmp != 1) {
              pcVar7 = "Cannot take in charge collections other than array decorrelation\n";
              goto LAB_00112701;
            }
            opj_read_bytes_LE(p_buffer + 1,&l_nb_comps,2);
            lVar12 = (ulong)(l_nb_comps >> 0xf) + 1;
            uVar1 = l_nb_comps & 0x7fff;
            poVar8->m_nb_comps = uVar1;
            uVar3 = (OPJ_UINT32)lVar12 * uVar1 + 2;
            local_5c = (uVar9 - 3) - uVar3;
            if (uVar9 - 3 < uVar3) goto LAB_00112575;
            pOVar14 = p_buffer + 5;
            p_buffer = p_buffer + 8;
            local_50 = p_manager;
            for (uVar9 = 0; uVar9 < uVar1; uVar9 = uVar9 + 1) {
              opj_read_bytes_LE(pOVar14 + -2,&l_tmp,(OPJ_UINT32)lVar12);
              if (uVar9 != l_tmp) {
                pcVar7 = "Cannot take in charge collections with indix shuffle\n";
                p_manager = local_50;
                goto LAB_001125b3;
              }
              uVar1 = poVar8->m_nb_comps;
              pOVar14 = pOVar14 + lVar12;
              p_buffer = p_buffer + lVar12;
            }
            opj_read_bytes_LE(pOVar14 + -2,&l_nb_comps,2);
            uVar9 = l_nb_comps & 0x7fff;
            OVar13 = 1;
            if (uVar9 != poVar8->m_nb_comps) {
              pcVar7 = "Cannot take in charge collections without same number of indixes\n";
              l_nb_comps = uVar9;
LAB_00112928:
              event_type = 2;
              p_manager = local_50;
              goto LAB_00112585;
            }
            lVar12 = (ulong)(l_nb_comps >> 0xf) + 1;
            OVar10 = (OPJ_UINT32)lVar12;
            uVar1 = OVar10 * uVar9 + 3;
            bVar15 = local_5c < uVar1;
            local_5c = local_5c - uVar1;
            if (bVar15) {
              pcVar7 = "Error reading MCC marker\n";
              OVar13 = 0;
              event_type = 1;
              p_manager = local_50;
              l_nb_comps = uVar9;
              goto LAB_00112585;
            }
            uVar1 = 0;
            l_nb_comps = uVar9;
            while( true ) {
              if (uVar9 <= uVar1) break;
              opj_read_bytes_LE(p_buffer + -3,&l_tmp,OVar10);
              if (uVar1 != l_tmp) {
                pcVar7 = "Cannot take in charge collections with indix shuffle\n";
                goto LAB_00112928;
              }
              uVar1 = uVar1 + 1;
              uVar9 = poVar8->m_nb_comps;
              p_buffer = p_buffer + lVar12;
            }
            opj_read_bytes_LE(p_buffer + -3,&l_tmp,3);
            poVar8->field_0x18 = poVar8->field_0x18 & 0xfe | (l_tmp >> 0x10 & 1) == 0;
            *local_38 = (opj_mct_data_t *)0x0;
            local_38[1] = (opj_mct_data_t *)0x0;
            l_indix = l_tmp & 0xff;
            p_manager = local_50;
            if (l_indix != 0) {
              poVar6 = poVar11->m_mct_records;
              OVar10 = poVar11->m_nb_mct_records;
              while( true ) {
                bVar15 = OVar10 == 0;
                OVar10 = OVar10 - 1;
                if (bVar15) goto LAB_00112575;
                if (poVar6->m_index == l_indix) break;
                poVar6 = poVar6 + 1;
              }
              *local_38 = poVar6;
            }
            l_indix = l_tmp >> 8 & 0xff;
            if (l_indix != 0) {
              poVar6 = poVar11->m_mct_records;
              OVar10 = poVar11->m_nb_mct_records;
              while( true ) {
                bVar15 = OVar10 == 0;
                OVar10 = OVar10 - 1;
                if (bVar15) goto LAB_00112575;
                if (poVar6->m_index == l_indix) break;
                poVar6 = poVar6 + 1;
              }
              poVar8->m_offset_array = poVar6;
            }
            uVar9 = local_5c;
            uVar1 = local_40 + 1;
          }
          if (uVar9 == 0) {
            if ((char)local_44 == '\0') {
              return 1;
            }
            poVar11->m_nb_mcc_records = poVar11->m_nb_mcc_records + 1;
            return 1;
          }
          goto LAB_00112575;
        }
        pcVar7 = "Cannot take in charge multiple collections\n";
      }
      else {
        pcVar7 = "Cannot take in charge multiple data spanning\n";
      }
LAB_00112701:
      OVar13 = 1;
      event_type = 2;
      goto LAB_00112585;
    }
    poVar11->m_nb_max_mcc_records = uVar9 + 10;
    poVar2 = (opj_simple_mcc_decorrelation_data_t *)opj_realloc(poVar2,(ulong)(uVar9 + 10) << 5);
    if (poVar2 != (opj_simple_mcc_decorrelation_data_t *)0x0) {
      poVar11->m_mcc_records = poVar2;
      memset(poVar2 + poVar11->m_nb_mcc_records,0,
             (ulong)(poVar11->m_nb_max_mcc_records - poVar11->m_nb_mcc_records) << 5);
      poVar2 = poVar11->m_mcc_records;
      uVar9 = poVar11->m_nb_mcc_records;
      goto LAB_001126a9;
    }
    opj_free(poVar11->m_mcc_records);
    poVar11->m_mcc_records = (opj_simple_mcc_decorrelation_data_t *)0x0;
    poVar11->m_nb_mcc_records = 0;
    poVar11->m_nb_max_mcc_records = 0;
    pcVar7 = "Not enough memory to read MCC marker\n";
  }
  OVar13 = 0;
  event_type = 1;
LAB_00112585:
  opj_event_msg(p_manager,event_type,pcVar7);
  return OVar13;
}

Assistant:

static OPJ_BOOL opj_j2k_read_mcc (     opj_j2k_t *p_j2k,
                                                OPJ_BYTE * p_header_data,
                                                OPJ_UINT32 p_header_size,
                                                opj_event_mgr_t * p_manager )
{
        OPJ_UINT32 i,j;
        OPJ_UINT32 l_tmp;
        OPJ_UINT32 l_indix;
        opj_tcp_t * l_tcp;
        opj_simple_mcc_decorrelation_data_t * l_mcc_record;
        opj_mct_data_t * l_mct_data;
        OPJ_UINT32 l_nb_collections;
        OPJ_UINT32 l_nb_comps;
        OPJ_UINT32 l_nb_bytes_by_comp;
        OPJ_BOOL l_new_mcc = OPJ_FALSE;

        /* preconditions */
        assert(p_header_data != 00);
        assert(p_j2k != 00);
        assert(p_manager != 00);

        l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
                        &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
                        p_j2k->m_specific_param.m_decoder.m_default_tcp;

        if (p_header_size < 2) {
                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                return OPJ_FALSE;
        }

        /* first marker */
        opj_read_bytes(p_header_data,&l_tmp,2);                         /* Zmcc */
        p_header_data += 2;
        if (l_tmp != 0) {
                opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge multiple data spanning\n");
                return OPJ_TRUE;
        }

        if (p_header_size < 7) {
                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                return OPJ_FALSE;
        }

        opj_read_bytes(p_header_data,&l_indix,1); /* Imcc -> no need for other values, take the first */
        ++p_header_data;

        l_mcc_record = l_tcp->m_mcc_records;

        for(i=0;i<l_tcp->m_nb_mcc_records;++i) {
                if (l_mcc_record->m_index == l_indix) {
                        break;
                }
                ++l_mcc_record;
        }

        /** NOT FOUND */
        if (i == l_tcp->m_nb_mcc_records) {
                if (l_tcp->m_nb_mcc_records == l_tcp->m_nb_max_mcc_records) {
                        opj_simple_mcc_decorrelation_data_t *new_mcc_records;
                        l_tcp->m_nb_max_mcc_records += OPJ_J2K_MCC_DEFAULT_NB_RECORDS;

                        new_mcc_records = (opj_simple_mcc_decorrelation_data_t *) opj_realloc(
                                        l_tcp->m_mcc_records, l_tcp->m_nb_max_mcc_records * sizeof(opj_simple_mcc_decorrelation_data_t));
                        if (! new_mcc_records) {
                                opj_free(l_tcp->m_mcc_records);
                                l_tcp->m_mcc_records = NULL;
                                l_tcp->m_nb_max_mcc_records = 0;
                                l_tcp->m_nb_mcc_records = 0;
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read MCC marker\n");
                                return OPJ_FALSE;
                        }
                        l_tcp->m_mcc_records = new_mcc_records;
                        l_mcc_record = l_tcp->m_mcc_records + l_tcp->m_nb_mcc_records;
                        memset(l_mcc_record,0,(l_tcp->m_nb_max_mcc_records-l_tcp->m_nb_mcc_records) * sizeof(opj_simple_mcc_decorrelation_data_t));
                }
                l_mcc_record = l_tcp->m_mcc_records + l_tcp->m_nb_mcc_records;
                l_new_mcc = OPJ_TRUE;
        }
        l_mcc_record->m_index = l_indix;

        /* only one marker atm */
        opj_read_bytes(p_header_data,&l_tmp,2);                         /* Ymcc */
        p_header_data+=2;
        if (l_tmp != 0) {
                opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge multiple data spanning\n");
                return OPJ_TRUE;
        }

        opj_read_bytes(p_header_data,&l_nb_collections,2);                              /* Qmcc -> number of collections -> 1 */
        p_header_data+=2;

        if (l_nb_collections > 1) {
                opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge multiple collections\n");
                return OPJ_TRUE;
        }

        p_header_size -= 7;

        for (i=0;i<l_nb_collections;++i) {
                if (p_header_size < 3) {
                        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                        return OPJ_FALSE;
                }

                opj_read_bytes(p_header_data,&l_tmp,1); /* Xmcci type of component transformation -> array based decorrelation */
                ++p_header_data;

                if (l_tmp != 1) {
                        opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge collections other than array decorrelation\n");
                        return OPJ_TRUE;
                }

                opj_read_bytes(p_header_data,&l_nb_comps,2);

                p_header_data+=2;
                p_header_size-=3;

                l_nb_bytes_by_comp = 1 + (l_nb_comps>>15);
                l_mcc_record->m_nb_comps = l_nb_comps & 0x7fff;

                if (p_header_size < (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 2)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                        return OPJ_FALSE;
                }

                p_header_size -= (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 2);

                for (j=0;j<l_mcc_record->m_nb_comps;++j) {
                        opj_read_bytes(p_header_data,&l_tmp,l_nb_bytes_by_comp);        /* Cmccij Component offset*/
                        p_header_data+=l_nb_bytes_by_comp;

                        if (l_tmp != j) {
                                opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge collections with indix shuffle\n");
                                return OPJ_TRUE;
                        }
                }

                opj_read_bytes(p_header_data,&l_nb_comps,2);
                p_header_data+=2;

                l_nb_bytes_by_comp = 1 + (l_nb_comps>>15);
                l_nb_comps &= 0x7fff;

                if (l_nb_comps != l_mcc_record->m_nb_comps) {
                        opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge collections without same number of indixes\n");
                        return OPJ_TRUE;
                }

                if (p_header_size < (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 3)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                        return OPJ_FALSE;
                }

                p_header_size -= (l_nb_bytes_by_comp * l_mcc_record->m_nb_comps + 3);

                for (j=0;j<l_mcc_record->m_nb_comps;++j) {
                        opj_read_bytes(p_header_data,&l_tmp,l_nb_bytes_by_comp);        /* Wmccij Component offset*/
                        p_header_data+=l_nb_bytes_by_comp;

                        if (l_tmp != j) {
                                opj_event_msg(p_manager, EVT_WARNING, "Cannot take in charge collections with indix shuffle\n");
                                return OPJ_TRUE;
                        }
                }

                opj_read_bytes(p_header_data,&l_tmp,3); /* Wmccij Component offset*/
                p_header_data += 3;

                l_mcc_record->m_is_irreversible = ! ((l_tmp>>16) & 1);
                l_mcc_record->m_decorrelation_array = 00;
                l_mcc_record->m_offset_array = 00;

                l_indix = l_tmp & 0xff;
                if (l_indix != 0) {
                        l_mct_data = l_tcp->m_mct_records;
                        for (j=0;j<l_tcp->m_nb_mct_records;++j) {
                                if (l_mct_data->m_index == l_indix) {
                                        l_mcc_record->m_decorrelation_array = l_mct_data;
                                        break;
                                }
                                ++l_mct_data;
                        }

                        if (l_mcc_record->m_decorrelation_array == 00) {
                                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                                return OPJ_FALSE;
                        }
                }

                l_indix = (l_tmp >> 8) & 0xff;
                if (l_indix != 0) {
                        l_mct_data = l_tcp->m_mct_records;
                        for (j=0;j<l_tcp->m_nb_mct_records;++j) {
                                if (l_mct_data->m_index == l_indix) {
                                        l_mcc_record->m_offset_array = l_mct_data;
                                        break;
                                }
                                ++l_mct_data;
                        }

                        if (l_mcc_record->m_offset_array == 00) {
                                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                                return OPJ_FALSE;
                        }
                }
        }

        if (p_header_size != 0) {
                opj_event_msg(p_manager, EVT_ERROR, "Error reading MCC marker\n");
                return OPJ_FALSE;
        }

        if (l_new_mcc) {
                ++l_tcp->m_nb_mcc_records;
        }

        return OPJ_TRUE;
}